

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O1

Socket * __thiscall asl::Socket::operator>>(Socket *this,longlong *x)

{
  SmartObject_ *pSVar1;
  long lVar2;
  undefined8 *puVar3;
  byte by [8];
  byte bx [8];
  undefined8 local_20;
  longlong local_18;
  
  pSVar1 = (this->super_SmartObject)._p;
  (*pSVar1->_vptr_SmartObject_[0xd])(pSVar1,x,8);
  if (*(int *)((long)&(this->super_SmartObject)._p[1]._vptr_SmartObject_ + 4) == 0) {
    local_18 = *x;
    lVar2 = 8;
    puVar3 = &local_20;
    do {
      *(undefined1 *)puVar3 = *(undefined1 *)((long)&local_20 + lVar2 + 7);
      puVar3 = (undefined8 *)((long)puVar3 + 1);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    *x = local_20;
  }
  return this;
}

Assistant:

Socket& operator>>(T& x)
	{
		read(&x, sizeof(x));
		if (endian() == ASL_OTHER_ENDIAN)
			swapBytes(x);
		return *this;
	}